

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter.hpp
# Opt level: O2

ConstantFilter * __thiscall duckdb::TableFilter::Cast<duckdb::ConstantFilter>(TableFilter *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->filter_type == CONSTANT_COMPARISON) {
    return (ConstantFilter *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Failed to cast to type - table filter type mismatch",&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const TARGET &Cast() const {
		if (filter_type != TARGET::TYPE) {
			throw InternalException("Failed to cast to type - table filter type mismatch");
		}
		return reinterpret_cast<const TARGET &>(*this);
	}